

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::ParseTableEntry(MovDemuxer *this,MOVAtom atom)

{
  Track *pTVar1;
  ParsedTrackPrivData *pPVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  void *__dest;
  uchar *puVar6;
  ulong __n;
  ulong uVar7;
  ulong uStack_30;
  int64_t local_18;
  
  uVar4 = (uint32_t)atom.offset;
  if ((int)atom.type < 0x6b617274) {
    if ((int)atom.type < 0x64686b74) {
      if ((int)atom.type < 0x61746475) {
        if ((atom.type + 0xbc9c899f < 0xd) &&
           ((0x1081U >> (atom.type + 0xbc9c899f & 0x1f) & 1) != 0)) {
LAB_001b71a2:
          iVar3 = mov_read_glbl(this,atom);
          return iVar3;
        }
        if (atom.type == 0x34366f63) goto LAB_001b720a;
        if (atom.type == 0x6169646d) goto LAB_001b72ff;
      }
      else if ((int)atom.type < 0x63737473) {
        if (atom.type == 0x61746475) goto LAB_001b72ff;
        if (atom.type == 0x63616c61) goto LAB_001b71c8;
      }
      else {
        if (atom.type == 0x63737473) {
          mov_read_stsc(this,atom);
          return 0;
        }
        if (atom.type == 0x6468646d) {
          iVar3 = mov_read_mdhd(this,atom);
          return iVar3;
        }
        if (atom.type == 0x64686674) {
          iVar3 = mov_read_tfhd(this,atom);
          return iVar3;
        }
      }
    }
    else {
      if (0x66617273 < (int)atom.type) {
        if ((int)atom.type < 0x666e696d) {
          if (atom.type != 0x66617274) {
            if (atom.type == 0x66657264) {
              return 0;
            }
            if (atom.type != 0x666e6964) goto LAB_001b7363;
          }
        }
        else if (atom.type != 0x666e696d) {
          if (atom.type != 0x666f6f6d) {
            if (atom.type == 0x6832706a) goto LAB_001b71c8;
            goto LAB_001b7363;
          }
          this->found_moof = true;
          (this->fragment).moof_offset = (this->super_IOContextDemuxer).m_processedBytes + -8;
        }
LAB_001b72ff:
        iVar3 = mov_read_default(this,atom);
        return iVar3;
      }
      if ((int)atom.type < 0x64737473) {
        if (atom.type == 0x64686b74) {
          return 0;
        }
        if (atom.type == 0x6468766d) {
          mov_read_mvhd(this,atom);
          return 0;
        }
      }
      else {
        if (atom.type == 0x64737473) {
          iVar3 = mov_read_stsd(this,atom);
          return iVar3;
        }
        if (atom.type == 0x65646977) {
          mov_read_wide(this,atom);
          return 0;
        }
        if (atom.type == 0x65766177) {
          iVar3 = mov_read_wave(this,atom);
          return iVar3;
        }
      }
    }
  }
  else if ((int)atom.type < 0x73737661) {
    if ((int)atom.type < 0x6e757274) {
      if ((int)atom.type < 0x6c627473) {
        if (atom.type == 0x6b617274) {
          iVar3 = mov_read_trak(this,atom);
          return iVar3;
        }
        if (atom.type == 0x6c626c67) goto LAB_001b71a2;
      }
      else {
        if (atom.type == 0x6c627473) goto LAB_001b72ff;
        if (atom.type == 0x6c656966) goto LAB_001b71c8;
        if (atom.type == 0x6e6b7274) {
          mov_read_trkn(this,atom);
          return 0;
        }
      }
    }
    else if ((int)atom.type < 0x726c6468) {
      if (atom.type == 0x6e757274) {
        iVar3 = mov_read_trun(this,atom);
        return iVar3;
      }
      if (atom.type == 0x6f637473) {
LAB_001b720a:
        iVar3 = mov_read_stco(this,atom);
        return iVar3;
      }
      if (atom.type == 0x70797466) {
        mov_read_ftyp(this,atom);
        return 0;
      }
    }
    else {
      if (atom.type == 0x726c6468) {
        mov_read_hdlr(this,atom);
        return 0;
      }
      if (atom.type == 0x73647365) {
        iVar3 = mov_read_esds(this,atom);
        return iVar3;
      }
      if (atom.type == 0x73737473) {
        iVar3 = mov_read_stss(this,atom);
        return iVar3;
      }
    }
  }
  else if ((int)atom.type < 0x74736c65) {
    if ((int)atom.type < 0x73747463) {
      if (atom.type == 0x73737661) {
LAB_001b71c8:
        iVar3 = mov_read_extradata(this,atom);
        return iVar3;
      }
      if (atom.type == 0x73746465) goto LAB_001b72ff;
    }
    else {
      if (atom.type == 0x73747463) {
        mov_read_ctts(this,atom);
        return 0;
      }
      if (atom.type == 0x73747473) {
        mov_read_stts(this,atom);
        return 0;
      }
      if (atom.type == 0x7461646d) {
        local_18 = atom.size;
        if (atom.size == 0) {
          return 0;
        }
        if (this->m_mdat_pos == 0) {
          this->m_mdat_pos = (this->super_IOContextDemuxer).m_processedBytes;
          this->m_mdat_size = atom.size;
        }
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        emplace_back<long&,long&>
                  ((vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                   &this->m_mdat_data,&(this->super_IOContextDemuxer).m_processedBytes,&local_18);
        return 0;
      }
    }
  }
  else if ((int)atom.type < 0x78657274) {
    if (atom.type == 0x74736c65) {
      mov_read_elst(this,atom);
      return 0;
    }
    if (atom.type == 0x766f6f6d) {
      iVar3 = mov_read_default(this,atom);
      if (-1 < iVar3) {
        this->found_moov = 1;
        return 0;
      }
      return -1;
    }
    if (atom.type == 0x766f6d63) {
      mov_read_cmov(this,atom);
      iVar3 = (this->super_IOContextDemuxer).num_tracks;
      if (0 < iVar3) {
        iVar5 = -1;
        if (uStack_30 < 0x80000000) {
          pTVar1 = (this->super_IOContextDemuxer).tracks[iVar3 - 1];
          __n = (ulong)pTVar1->codec_priv_size;
          if ((long)(uStack_30 + __n) < 0x7ffffff8) {
            uVar7 = uStack_30 + __n + 8;
            __dest = operator_new__(__n);
            memcpy(__dest,pTVar1->codec_priv,__n);
            if (pTVar1->codec_priv != (uchar *)0x0) {
              operator_delete__(pTVar1->codec_priv);
            }
            puVar6 = (uchar *)operator_new__(uVar7);
            pTVar1->codec_priv = puVar6;
            memcpy(puVar6,__dest,__n);
            operator_delete__(__dest);
            puVar6 = pTVar1->codec_priv;
            AV_WB32(puVar6 + __n,(uint)uStack_30 + 8);
            uVar4 = my_ntohl(uVar4);
            AV_WB32(puVar6 + __n + 4,uVar4);
            IOContextDemuxer::get_buffer
                      (&this->super_IOContextDemuxer,puVar6 + __n + 8,(uint)uStack_30);
            pTVar1->codec_priv_size = (int)uVar7;
            pPVar2 = pTVar1->parsed_priv_data;
            if (pPVar2 != (ParsedTrackPrivData *)0x0) {
              (*pPVar2->_vptr_ParsedTrackPrivData[2])(pPVar2,pTVar1->codec_priv,uVar7 & 0xffffffff);
            }
            iVar5 = 0;
          }
        }
        return iVar5;
      }
      return 0;
    }
  }
  else {
    if (atom.type == 0x78657274) {
      mov_read_trex(this,atom);
      return 0;
    }
    if (atom.type == 0x7865766d) goto LAB_001b72ff;
    if (atom.type == 0x7a737473) {
      iVar3 = mov_read_stsz(this,atom);
      return iVar3;
    }
  }
LAB_001b7363:
  if ((char)atom.type != -0x57) {
    return 0;
  }
  iVar3 = mov_read_udta_string(this,atom);
  return iVar3;
}

Assistant:

int MovDemuxer::ParseTableEntry(MOVAtom atom)
{
    switch (atom.type)
    {
    case MKTAG('a', 'v', 's', 's'):
        return mov_read_extradata(atom);
    case MKTAG('c', 'm', 'o', 'v'):
        return mov_read_cmov(atom);
    case MKTAG('c', 'o', '6', '4'):
        return mov_read_stco(atom);
    case MKTAG('c', 't', 't', 's'):
        return mov_read_ctts(atom);
    case MKTAG('d', 'i', 'n', 'f'):
    case MKTAG('e', 'd', 't', 's'):
    case MKTAG('m', 'd', 'i', 'a'):
    case MKTAG('m', 'i', 'n', 'f'):
    case MKTAG('m', 'v', 'e', 'x'):
    case MKTAG('s', 't', 'b', 'l'):
    case MKTAG('t', 'r', 'a', 'f'):
    case MKTAG('u', 'd', 't', 'a'):
        return mov_read_default(atom);
    case MKTAG('d', 'r', 'e', 'f'):
        return mov_read_dref(atom);
    case MKTAG('e', 'l', 's', 't'):
        return mov_read_elst(atom);
    case MKTAG('e', 's', 'd', 's'):
        return mov_read_esds(atom);
    case MKTAG('a', 'l', 'a', 'c'):
    case MKTAG('f', 'i', 'e', 'l'):
    case MKTAG('j', 'p', '2', 'h'):
        return mov_read_extradata(atom);
    case MKTAG('f', 't', 'y', 'p'):
        return mov_read_ftyp(atom);
    case MKTAG('a', 'v', 'c', 'C'):
    case MKTAG('g', 'l', 'b', 'l'):
    case MKTAG('m', 'v', 'c', 'C'):
    case MKTAG('h', 'v', 'c', 'C'):
        return mov_read_glbl(atom);
    case MKTAG('h', 'd', 'l', 'r'):
        return mov_read_hdlr(atom);
    case MKTAG('m', 'd', 'a', 't'):
        return mov_read_mdat(atom);
    case MKTAG('m', 'd', 'h', 'd'):
        return mov_read_mdhd(atom);
    case MKTAG('m', 'o', 'o', 'f'):
        return mov_read_moof(atom);
    case MKTAG('m', 'o', 'o', 'v'):
        return mov_read_moov(atom);
    case MKTAG('m', 'v', 'h', 'd'):
        return mov_read_mvhd(atom);
    case MKTAG('s', 't', 'c', 'o'):
        return mov_read_stco(atom);
    case MKTAG('s', 't', 's', 'c'):
        return mov_read_stsc(atom);
    case MKTAG('s', 't', 's', 'd'):
        return mov_read_stsd(atom);
    case MKTAG('s', 't', 's', 's'):
        return mov_read_stss(atom);
    case MKTAG('s', 't', 's', 'z'):
        return mov_read_stsz(atom);
    case MKTAG('s', 't', 't', 's'):
        return mov_read_stts(atom);
    case MKTAG('t', 'k', 'h', 'd'):
        return mov_read_tkhd(atom);
    case MKTAG('t', 'f', 'h', 'd'):
        return mov_read_tfhd(atom);
    case MKTAG('t', 'r', 'a', 'k'):
        return mov_read_trak(atom);
    case MKTAG('t', 'r', 'e', 'x'):
        return mov_read_trex(atom);
    case MKTAG('t', 'r', 'k', 'n'):
        return mov_read_trkn(atom);
    case MKTAG('t', 'r', 'u', 'n'):
        return mov_read_trun(atom);
    case MKTAG('w', 'a', 'v', 'e'):
        return mov_read_wave(atom);
    case MKTAG('w', 'i', 'd', 'e'):
        return mov_read_wide(atom);
    default:
        break;
    }

    // Apple QuickTime tags
    if ((atom.type & 0xff) == 0xa9)
        return mov_read_udta_string(atom);

    return 0;
}